

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_11,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  int in_ECX;
  float *pfVar2;
  undefined4 in_register_00000014;
  ShaderEvalContext *extraout_RDX;
  ShaderEvalContext *extraout_RDX_00;
  ShaderEvalContext *evalCtx_00;
  long lVar3;
  long lVar4;
  Matrix<float,_2,_4> *pMVar5;
  Matrix<float,_2,_4> retVal;
  Type in1;
  Type in0;
  Matrix<float,_2,_4> local_a8;
  Mat4x2 local_80;
  Mat4x2 local_60;
  Vector<float,_3> local_40;
  VecAccess<float,_4,_3> local_30;
  
  pMVar5 = &local_a8;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,11>
              (&local_60,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    evalCtx_00 = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_2,_4>::Matrix(&local_60,(float *)sr::(anonymous_namespace)::s_constInMat4x2);
    evalCtx_00 = extraout_RDX_00;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,11>
              (&local_80,(MatrixCaseUtils *)evalCtx,evalCtx_00,in_ECX);
  }
  else {
    tcu::Matrix<float,_2,_4>::Matrix
              (&local_80,(float *)(sr::(anonymous_namespace)::s_constInMat4x2 + 0x20));
  }
  tcu::Matrix<float,_2,_4>::Matrix(&local_a8);
  pfVar1 = (float *)&local_80;
  pfVar2 = (float *)&local_60;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      *(float *)((long)pMVar5 + lVar4 * 8) = pfVar2[lVar4 * 2] * pfVar1[lVar4 * 2];
    }
    pMVar5 = (Matrix<float,_2,_4> *)((long)pMVar5 + 4);
    pfVar1 = pfVar1 + 1;
    pfVar2 = pfVar2 + 1;
  }
  local_40.m_data[2] = local_a8.m_data.m_data[2].m_data[0] + local_a8.m_data.m_data[2].m_data[1];
  local_40.m_data[0] =
       local_a8.m_data.m_data[3].m_data[0] +
       local_a8.m_data.m_data[0].m_data[0] + local_a8.m_data.m_data[0].m_data[1];
  local_40.m_data[1] =
       local_a8.m_data.m_data[3].m_data[1] +
       local_a8.m_data.m_data[1].m_data[1] + local_a8.m_data.m_data[1].m_data[0];
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_40);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}